

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Palette.cpp
# Opt level: O0

void __thiscall
sfc::Palette::add_images
          (Palette *this,vector<sfc::Image,_std::allocator<sfc::Image>_> *palette_tiles)

{
  allocator<unsigned_int> *this_00;
  uint uVar1;
  string_view fmt;
  FILE *pFVar2;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> __a;
  bool bVar3;
  size_type sVar4;
  size_type sVar5;
  runtime_error *this_01;
  reference this_02;
  iterator __first;
  iterator __last;
  iterator __b;
  uint *in_R9;
  pair<std::_Rb_tree_const_iterator<unsigned_int>,_bool> pVar6;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_338;
  rgba_t local_32c;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_328;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_320;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_318;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> p;
  undefined1 local_2f8 [8];
  rgba_vec_t cv;
  Subpalette *sp;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *cs;
  iterator __end1_1;
  iterator __begin1_1;
  rgba_set_vec_t *__range1_1;
  rgba_set_vec_t optimized;
  rgba_set_t local_270;
  rgba_set_t local_240;
  _Base_ptr local_210;
  undefined1 local_208;
  undefined1 local_200 [8];
  rgba_set_t colors;
  rgba_set_t local_1c8;
  size_type local_198;
  char *local_190;
  size_t local_188;
  rgba_set_t local_170;
  reference local_140;
  Image *c;
  iterator __end1;
  iterator __begin1;
  vector<sfc::Image,_std::allocator<sfc::Image>_> *__range1;
  rgba_set_vec_t palettes;
  vector<sfc::Image,_std::allocator<sfc::Image>_> *palette_tiles_local;
  Palette *this_local;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_long,_unsigned_int,_unsigned_int,_unsigned_int>
  *local_f0;
  char *local_e8;
  size_t local_e0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_long,_unsigned_int,_unsigned_int,_unsigned_int>
  local_d8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_long,_unsigned_int,_unsigned_int,_unsigned_int>
  *local_90;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_long,_unsigned_int,_unsigned_int,_unsigned_int>
  *vargs;
  uint *local_80;
  uint *local_78;
  v10 *local_70;
  FILE *local_68;
  char *local_60;
  size_t sStack_58;
  char **local_50;
  char *local_48;
  size_t sStack_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_long,_unsigned_int,_unsigned_int,_unsigned_int>
  *local_38;
  Palette **local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_long,_unsigned_int,_unsigned_int,_unsigned_int>
  *local_28;
  undefined8 local_20;
  Palette **local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_long,_unsigned_int,_unsigned_int,_unsigned_int>
  *local_10;
  
  palettes.
  super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)palette_tiles;
  memset(&__range1,0,0x18);
  std::
  vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
            *)&__range1);
  __end1 = std::vector<sfc::Image,_std::allocator<sfc::Image>_>::begin(palette_tiles);
  c = (Image *)std::vector<sfc::Image,_std::allocator<sfc::Image>_>::end(palette_tiles);
  while (bVar3 = __gnu_cxx::
                 operator==<sfc::Image_*,_std::vector<sfc::Image,_std::allocator<sfc::Image>_>_>
                           (&__end1,(__normal_iterator<sfc::Image_*,_std::vector<sfc::Image,_std::allocator<sfc::Image>_>_>
                                     *)&c), ((bVar3 ^ 0xffU) & 1) != 0) {
    local_140 = __gnu_cxx::
                __normal_iterator<sfc::Image_*,_std::vector<sfc::Image,_std::allocator<sfc::Image>_>_>
                ::operator*(&__end1);
    Image::colors(&local_170,local_140);
    sVar4 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::size
                      (&local_170);
    uVar1 = this->_max_colors_per_subpalette;
    std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set(&local_170)
    ;
    pFVar2 = _stderr;
    if (uVar1 < sVar4) {
      local_190 = "  Tile with too many ({} > {}) unique colors at {},{} in source image\n";
      local_188 = 0x46;
      Image::colors(&local_1c8,local_140);
      local_198 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                  size(&local_1c8);
      colors._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = Image::src_coord_x(local_140);
      colors._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = Image::src_coord_y(local_140);
      local_60 = local_190;
      sStack_58 = local_188;
      local_68 = pFVar2;
      local_70 = (v10 *)&local_198;
      local_80 = (uint *)((long)&colors._M_t._M_impl.super__Rb_tree_header._M_node_count + 4);
      vargs = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_long,_unsigned_int,_unsigned_int,_unsigned_int>
               *)&colors._M_t._M_impl.super__Rb_tree_header._M_node_count;
      local_78 = &this->_max_colors_per_subpalette;
      ::fmt::v10::
      make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_long,unsigned_int,unsigned_int,unsigned_int>
                (&local_d8,local_70,(unsigned_long *)&this->_max_colors_per_subpalette,local_80,
                 (uint *)vargs,in_R9);
      local_90 = &local_d8;
      local_50 = &local_60;
      local_e8 = local_60;
      local_e0 = sStack_58;
      local_30 = &this_local;
      local_20 = 0x2224;
      this_local = (Palette *)0x2224;
      local_f0 = local_90;
      fmt.size_ = sStack_58;
      fmt.data_ = local_60;
      local_48 = local_e8;
      sStack_40 = local_e0;
      local_38 = local_90;
      local_28 = local_90;
      local_18 = local_30;
      local_10 = local_90;
      ::fmt::v10::vprint(local_68,fmt,_this_local);
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
                (&local_1c8);
    }
    if ((this->_col0_is_shared & 1U) == 0) {
      Image::colors((rgba_set_t *)
                    &optimized.
                     super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,local_140);
      reduce_colors(&local_270,
                    (rgba_set_t *)
                    &optimized.
                     super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,this->_mode);
      std::
      vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
      ::push_back((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                   *)&__range1,&local_270);
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
                (&local_270);
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
                ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                 &optimized.
                  super__Vector_base<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    else {
      Image::colors((rgba_set_t *)local_200,local_140);
      pVar6 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::insert
                        ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                          *)local_200,&this->_col0);
      local_210 = (_Base_ptr)pVar6.first._M_node;
      local_208 = pVar6.second;
      reduce_colors(&local_240,(rgba_set_t *)local_200,this->_mode);
      std::
      vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
      ::push_back((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                   *)&__range1,&local_240);
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
                (&local_240);
      std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::~set
                ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
                 local_200);
    }
    __gnu_cxx::
    __normal_iterator<sfc::Image_*,_std::vector<sfc::Image,_std::allocator<sfc::Image>_>_>::
    operator++(&__end1);
  }
  optimized_palettes((rgba_set_vec_t *)&__range1_1,this,(rgba_set_vec_t *)&__range1);
  sVar5 = std::
          vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
          ::size((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                  *)&__range1_1);
  if (sVar5 <= this->_max_subpalettes) {
    __end1_1 = std::
               vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
               ::begin((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                        *)&__range1_1);
    cs = (set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
         std::
         vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
         ::end((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                *)&__range1_1);
    while (bVar3 = __gnu_cxx::
                   operator==<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_*,_std::vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                             (&__end1_1,
                              (__normal_iterator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_*,_std::vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                               *)&cs), ((bVar3 ^ 0xffU) & 1) != 0) {
      this_02 = __gnu_cxx::
                __normal_iterator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_*,_std::vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
                ::operator*(&__end1_1);
      cv.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = &add_subpalette(this)->_mode;
      __first = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                begin(this_02);
      __last = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                         (this_02);
      this_00 = (allocator<unsigned_int> *)((long)&p._M_current + 7);
      std::allocator<unsigned_int>::allocator(this_00);
      std::vector<unsigned_int,std::allocator<unsigned_int>>::
      vector<std::_Rb_tree_const_iterator<unsigned_int>,void>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_2f8,
                 (_Rb_tree_const_iterator<unsigned_int>)__first._M_node,
                 (_Rb_tree_const_iterator<unsigned_int>)__last._M_node,this_00);
      std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&p._M_current + 7))
      ;
      if ((this->_col0_is_shared & 1U) != 0) {
        local_320._M_current =
             (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2f8);
        local_328._M_current =
             (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2f8);
        local_32c = reduce_color(this->_col0,this->_mode);
        local_318 = std::
                    find<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int>
                              (local_320,local_328,&local_32c);
        local_338._M_current =
             (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2f8);
        bVar3 = __gnu_cxx::
                operator==<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          (&local_318,&local_338);
        __a._M_current = local_318._M_current;
        if (((bVar3 ^ 0xffU) & 1) != 0) {
          __b = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2f8);
          std::
          iter_swap<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                    (__a,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                          )__b._M_current);
        }
      }
      Subpalette::add((Subpalette *)
                      cv.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,(rgba_vec_t *)local_2f8,false,false)
      ;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_2f8);
      __gnu_cxx::
      __normal_iterator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_*,_std::vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>
      ::operator++(&__end1_1);
    }
    std::
    vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
    ::~vector((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
               *)&__range1_1);
    std::
    vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
    ::~vector((vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
               *)&__range1);
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_01,"Colors in image do not fit in available palettes. Aborting.");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Palette::add_images(std::vector<sfc::Image> palette_tiles) {

  // make vector of sets of all tiles' colors
  rgba_set_vec_t palettes = rgba_set_vec_t();
  for (const auto& c : palette_tiles) {

    if (c.colors().size() > _max_colors_per_subpalette) {
      fmt::print(stderr, "  Tile with too many ({} > {}) unique colors at {},{} in source image\n", c.colors().size(), _max_colors_per_subpalette, c.src_coord_x(), c.src_coord_y());
    }

    if (_col0_is_shared) {
      auto colors = c.colors();
      colors.insert(_col0);
      palettes.push_back(reduce_colors(colors, _mode));
    } else {
      palettes.push_back(reduce_colors(c.colors(), _mode));
    }
  }

  // optimize
  auto optimized = optimized_palettes(palettes);

  // TODO: if throw iterate all palette_tiles and report positions
  if (optimized.size() > _max_subpalettes)
    throw std::runtime_error("Colors in image do not fit in available palettes. Aborting.");

  // add subpalettes
  for (auto& cs : optimized) {
    auto& sp = add_subpalette();
    rgba_vec_t cv(cs.begin(), cs.end());

    if (_col0_is_shared) {
      auto p = std::find(cv.begin(), cv.end(), reduce_color(_col0, _mode));
      if (p != cv.end())
        std::iter_swap(p, cv.begin());
    }

    sp.add(cv);
  }
}